

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgParticleSwarm.hpp
# Opt level: O0

void __thiscall TasOptimization::ParticleSwarmState::~ParticleSwarmState(ParticleSwarmState *this)

{
  ParticleSwarmState *this_local;
  
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->cache_best_particle_inside);
  std::vector<bool,_std::allocator<bool>_>::~vector(&this->cache_particle_inside);
  std::vector<double,_std::allocator<double>_>::~vector(&this->cache_best_particle_fvals);
  std::vector<double,_std::allocator<double>_>::~vector(&this->cache_particle_fvals);
  std::vector<double,_std::allocator<double>_>::~vector(&this->best_particle_positions);
  std::vector<double,_std::allocator<double>_>::~vector(&this->particle_velocities);
  std::vector<double,_std::allocator<double>_>::~vector(&this->particle_positions);
  return;
}

Assistant:

ParticleSwarmState() = delete;